

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcAnnotation::~IfcAnnotation(IfcAnnotation *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x851518;
  *(undefined8 *)&(this->super_IfcProduct).field_0x110 = 0x851590;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x851540;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x851568;
  puVar2 = *(undefined1 **)
            &(this->super_IfcProduct).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  puVar1 = &(this->super_IfcProduct).super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x851630;
  *(undefined8 *)&(this->super_IfcProduct).field_0x110 = 0x851658;
  puVar2 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x60;
  puVar1 = &(this->super_IfcProduct).super_IfcObject.field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x38;
  puVar1 = &(this->super_IfcProduct).super_IfcObject.field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcProduct).super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
    return;
  }
  return;
}

Assistant:

IfcAnnotation() : Object("IfcAnnotation") {}